

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftext.c
# Opt level: O2

int fftInit(long M)

{
  float *Utbl;
  short *psVar1;
  int iVar2;
  ulong uVar3;
  
  if ((ulong)M < 0x40) {
    iVar2 = 0;
    if (UtblArray[M] == (float *)0x0) {
      Utbl = (float *)malloc((1L << (M & 0x3fU) & 0xfffffffffffffffcU) + 4);
      UtblArray[M] = Utbl;
      if (Utbl == (float *)0x0) {
        iVar2 = 2;
      }
      else {
        fftCosInit(M,Utbl);
        iVar2 = 0;
      }
      if (1 < (ulong)M) {
        uVar3 = (ulong)M >> 1;
        if (BRLowArray[uVar3] == (short *)0x0) {
          psVar1 = (short *)malloc(1L << (uVar3 & 0x3f));
          BRLowArray[uVar3] = psVar1;
          if (psVar1 == (short *)0x0) {
            iVar2 = 2;
          }
          else {
            fftBRInit(M,psVar1);
          }
        }
        if (M != 2) {
          uVar3 = M - 1U >> 1;
          if (BRLowArray[uVar3] == (short *)0x0) {
            psVar1 = (short *)malloc(1L << (uVar3 & 0x3f));
            BRLowArray[uVar3] = psVar1;
            if (psVar1 == (short *)0x0) {
              iVar2 = 2;
            }
            else {
              fftBRInit(M - 1U,psVar1);
            }
          }
        }
      }
    }
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int fftInit(long M){
// malloc and init cosine and bit reversed tables for a given size fft, ifft, rfft, rifft
/* INPUTS */
/* M = log2 of fft size	(ex M=10 for 1024 point fft) */
/* OUTPUTS */
/* private cosine and bit reversed tables	*/

int theError = 1;
/*** I did NOT test cases with M>27 ***/
if ((M >= 0) && (M < 8*sizeof(long))){
	theError = 0;
	if (UtblArray[M] == 0){	// have we not inited this size fft yet?
		// init cos table
		UtblArray[M] = (float *) malloc( (POW2(M)/4+1)*sizeof(float) );
		if (UtblArray[M] == 0)
			theError = 2;
		else{
			fftCosInit(M, UtblArray[M]);
		}
		if (M > 1){
			if (BRLowArray[M/2] == 0){	// init bit reversed table for cmplx fft
				BRLowArray[M/2] = (short *) malloc( POW2(M/2-1)*sizeof(short) );
				if (BRLowArray[M/2] == 0)
					theError = 2;
				else{
					fftBRInit(M, BRLowArray[M/2]);
				}
			}
		}
		if (M > 2){
			if (BRLowArray[(M-1)/2] == 0){	// init bit reversed table for real fft
				BRLowArray[(M-1)/2] = (short *) malloc( POW2((M-1)/2-1)*sizeof(short) );
				if (BRLowArray[(M-1)/2] == 0)
					theError = 2;
				else{
					fftBRInit(M-1, BRLowArray[(M-1)/2]);
				}
			}
		}
	}
};
return theError;
}